

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int xmlCharEncInput(xmlParserInputBufferPtr input,int flush)

{
  xmlBufPtr buf_00;
  xmlBufPtr buf_01;
  xmlCharEncodingHandler *handler;
  xmlChar *out_00;
  xmlChar *in_00;
  byte *pbVar1;
  int local_ac;
  xmlChar *content;
  char buf [50];
  xmlBufPtr out;
  xmlBufPtr in;
  int c_out;
  int c_in;
  size_t toconv;
  size_t written;
  int ret;
  int flush_local;
  xmlParserInputBufferPtr input_local;
  
  if ((((input == (xmlParserInputBufferPtr)0x0) ||
       (input->encoder == (xmlCharEncodingHandlerPtr)0x0)) || (input->buffer == (xmlBufPtr)0x0)) ||
     (input->raw == (xmlBufPtr)0x0)) {
    input_local._4_4_ = -1;
  }
  else {
    buf_00 = input->buffer;
    buf_01 = input->raw;
    written._4_4_ = flush;
    _ret = input;
    _c_out = xmlBufUse(buf_01);
    if (_c_out == 0) {
      input_local._4_4_ = 0;
    }
    else {
      if ((0x10000 < _c_out) && (written._4_4_ == 0)) {
        _c_out = 0x10000;
      }
      toconv = xmlBufAvail(buf_00);
      if (toconv != 0) {
        toconv = toconv - 1;
      }
      if (toconv <= _c_out << 1) {
        xmlBufGrow(buf_00,(int)(_c_out << 1));
        toconv = xmlBufAvail(buf_00);
        if (toconv != 0) {
          toconv = toconv - 1;
        }
      }
      if ((0x20000 < toconv) && (written._4_4_ == 0)) {
        toconv = 0x20000;
      }
      in._4_4_ = (int)_c_out;
      in._0_4_ = (int)toconv;
      handler = _ret->encoder;
      out_00 = xmlBufEnd(buf_00);
      in_00 = xmlBufContent(buf_01);
      written._0_4_ =
           xmlEncInputChunk(handler,out_00,(int *)&in,in_00,(int *)((long)&in + 4),written._4_4_);
      xmlBufShrink(buf_01,(long)in._4_4_);
      xmlBufAddLen(buf_00,(long)(int)in);
      if ((int)written == -1) {
        written._0_4_ = -3;
      }
      switch((int)written) {
      case 0:
        break;
      case -3:
        break;
      case -2:
        pbVar1 = xmlBufContent(buf_01);
        snprintf((char *)&content,0x31,"0x%02X 0x%02X 0x%02X 0x%02X",(ulong)*pbVar1,(ulong)pbVar1[1]
                 ,(ulong)pbVar1[2],(uint)pbVar1[3]);
        buf[0x29] = '\0';
        xmlEncodingErr(XML_I18N_CONV_FAILED,"input conversion failed due to input error, bytes %s\n"
                       ,(char *)&content);
        break;
      case -1:
      }
      if ((int)written == -3) {
        written._0_4_ = 0;
      }
      if ((int)in == 0) {
        local_ac = (int)written;
      }
      else {
        local_ac = (int)in;
      }
      input_local._4_4_ = local_ac;
    }
  }
  return input_local._4_4_;
}

Assistant:

int
xmlCharEncInput(xmlParserInputBufferPtr input, int flush)
{
    int ret;
    size_t written;
    size_t toconv;
    int c_in;
    int c_out;
    xmlBufPtr in;
    xmlBufPtr out;

    if ((input == NULL) || (input->encoder == NULL) ||
        (input->buffer == NULL) || (input->raw == NULL))
        return (-1);
    out = input->buffer;
    in = input->raw;

    toconv = xmlBufUse(in);
    if (toconv == 0)
        return (0);
    if ((toconv > 64 * 1024) && (flush == 0))
        toconv = 64 * 1024;
    written = xmlBufAvail(out);
    if (written > 0)
        written--; /* count '\0' */
    if (toconv * 2 >= written) {
        xmlBufGrow(out, toconv * 2);
        written = xmlBufAvail(out);
        if (written > 0)
            written--; /* count '\0' */
    }
    if ((written > 128 * 1024) && (flush == 0))
        written = 128 * 1024;

    c_in = toconv;
    c_out = written;
    ret = xmlEncInputChunk(input->encoder, xmlBufEnd(out), &c_out,
                           xmlBufContent(in), &c_in, flush);
    xmlBufShrink(in, c_in);
    xmlBufAddLen(out, c_out);
    if (ret == -1)
        ret = -3;

    switch (ret) {
        case 0:
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
                            "converted %d bytes to %d bytes of input\n",
                            c_in, c_out);
#endif
            break;
        case -1:
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
                         "converted %d bytes to %d bytes of input, %d left\n",
                            c_in, c_out, (int)xmlBufUse(in));
#endif
            break;
        case -3:
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
                        "converted %d bytes to %d bytes of input, %d left\n",
                            c_in, c_out, (int)xmlBufUse(in));
#endif
            break;
        case -2: {
            char buf[50];
            const xmlChar *content = xmlBufContent(in);

	    snprintf(&buf[0], 49, "0x%02X 0x%02X 0x%02X 0x%02X",
		     content[0], content[1],
		     content[2], content[3]);
	    buf[49] = 0;
	    xmlEncodingErr(XML_I18N_CONV_FAILED,
		    "input conversion failed due to input error, bytes %s\n",
		           buf);
        }
    }
    /*
     * Ignore when input buffer is not on a boundary
     */
    if (ret == -3)
        ret = 0;
    return (c_out? c_out : ret);
}